

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O0

void __thiscall kratos::Param::set_value(Param *this,int64_t new_value)

{
  initializer_list<const_kratos::IRNode_*> __l;
  bool bVar1;
  uint32_t uVar2;
  VarException *this_00;
  reference ppVVar3;
  uint32_t *puVar4;
  reference __t;
  __tuple_element_t<0UL,_tuple<Var_*,_unsigned_int,_Var_*>_> *ppVVar5;
  __tuple_element_t<1UL,_tuple<Var_*,_unsigned_int,_Var_*>_> *p_Var6;
  __tuple_element_t<2UL,_tuple<Var_*,_unsigned_int,_Var_*>_> *ppVVar7;
  reference ppPVar8;
  remove_reference_t<long_&> *in_R8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  format_args args;
  string_view format_str;
  Param **param;
  iterator __end1_2;
  iterator __begin1_2;
  unordered_set<kratos::Param_*,_std::hash<kratos::Param_*>,_std::equal_to<kratos::Param_*>,_std::allocator<kratos::Param_*>_>
  *__range1_2;
  type *expr;
  type *index;
  type *var_1;
  _Self local_168;
  iterator __end1_1;
  iterator __begin1_1;
  set<std::tuple<kratos::Var_*,_unsigned_int,_kratos::Var_*>,_std::less<std::tuple<kratos::Var_*,_unsigned_int,_kratos::Var_*>_>,_std::allocator<std::tuple<kratos::Var_*,_unsigned_int,_kratos::Var_*>_>_>
  *__range1_1;
  Var **var;
  iterator __end1;
  iterator __begin1;
  unordered_set<kratos::Var_*,_std::hash<kratos::Var_*>,_std::equal_to<kratos::Var_*>,_std::allocator<kratos::Var_*>_>
  *__range1;
  Param *local_128;
  Param **local_120;
  size_type local_118;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_110;
  char local_e8 [32];
  string local_c8;
  undefined1 local_a8 [8];
  int64_t new_value_local;
  Param *this_local;
  undefined8 local_90;
  basic_string_view<char> local_88;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
  local_78;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
  *local_58;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
  *vargs;
  char (*local_48) [80];
  char *local_40;
  string *local_38;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
  *local_30;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_28;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
  *local_20;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_18;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
  *local_10;
  
  local_a8 = (undefined1  [8])new_value;
  new_value_local = (int64_t)this;
  if (new_value < 1) {
    bVar1 = std::
            unordered_set<kratos::Var_*,_std::hash<kratos::Var_*>,_std::equal_to<kratos::Var_*>,_std::allocator<kratos::Var_*>_>
            ::empty(&this->param_vars_width_);
    if (!bVar1) {
      __range1._6_1_ = 1;
      this_00 = (VarException *)__cxa_allocate_exception(0x10);
      (*(this->super_Const).super_Var.super_IRNode._vptr_IRNode[0x1f])(local_e8);
      local_38 = &local_c8;
      local_40 = "{0} is used for parametrizing variable width, thus cannot be non-positive ({1})";
      local_48 = (char (*) [80])local_e8;
      vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
               *)local_a8;
      fmt::v7::make_args_checked<std::__cxx11::string,long&,char[80],char>
                (&local_78,
                 (v7 *)
                 "{0} is used for parametrizing variable width, thus cannot be non-positive ({1})",
                 local_48,(remove_reference_t<std::__cxx11::basic_string<char>_> *)vargs,in_R8);
      local_58 = &local_78;
      local_88 = fmt::v7::to_string_view<char,_0>(local_40);
      local_28 = (basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                  *)&this_local;
      local_30 = local_58;
      local_20 = local_58;
      local_10 = local_58;
      local_18 = local_28;
      fmt::v7::
      basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      ::basic_format_args(local_28,0x3d,
                          (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                           *)local_58);
      args.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.values_ = in_R9.values_;
      args.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = local_90;
      format_str.size_ = (size_t)this_local;
      format_str.data_ = (char *)local_88.size_;
      fmt::v7::detail::vformat_abi_cxx11_(&local_c8,(detail *)local_88.data_,format_str,args);
      local_120 = &local_128;
      local_118 = 1;
      local_128 = this;
      std::allocator<const_kratos::IRNode_*>::allocator
                ((allocator<const_kratos::IRNode_*> *)((long)&__range1 + 7));
      __l._M_len = local_118;
      __l._M_array = (iterator)local_120;
      std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                (&local_110,__l,(allocator<const_kratos::IRNode_*> *)((long)&__range1 + 7));
      VarException::VarException(this_00,&local_c8,&local_110);
      __range1._6_1_ = 0;
      __cxa_throw(this_00,&VarException::typeinfo,VarException::~VarException);
    }
  }
  Const::set_value(&this->super_Const,(int64_t)local_a8);
  this->has_value_ = true;
  __end1 = std::
           unordered_set<kratos::Var_*,_std::hash<kratos::Var_*>,_std::equal_to<kratos::Var_*>,_std::allocator<kratos::Var_*>_>
           ::begin(&this->param_vars_width_);
  var = (Var **)std::
                unordered_set<kratos::Var_*,_std::hash<kratos::Var_*>,_std::equal_to<kratos::Var_*>,_std::allocator<kratos::Var_*>_>
                ::end(&this->param_vars_width_);
  while( true ) {
    bVar1 = std::__detail::operator!=
                      (&__end1.super__Node_iterator_base<kratos::Var_*,_false>,
                       (_Node_iterator_base<kratos::Var_*,_false> *)&var);
    if (!bVar1) break;
    ppVVar3 = std::__detail::_Node_iterator<kratos::Var_*,_true,_false>::operator*(&__end1);
    uVar2 = local_a8._0_4_;
    puVar4 = Var::var_width(*ppVVar3);
    *puVar4 = uVar2;
    std::__detail::_Node_iterator<kratos::Var_*,_true,_false>::operator++(&__end1);
  }
  __end1_1 = std::
             set<std::tuple<kratos::Var_*,_unsigned_int,_kratos::Var_*>,_std::less<std::tuple<kratos::Var_*,_unsigned_int,_kratos::Var_*>_>,_std::allocator<std::tuple<kratos::Var_*,_unsigned_int,_kratos::Var_*>_>_>
             ::begin(&this->param_vars_size_);
  local_168._M_node =
       (_Base_ptr)
       std::
       set<std::tuple<kratos::Var_*,_unsigned_int,_kratos::Var_*>,_std::less<std::tuple<kratos::Var_*,_unsigned_int,_kratos::Var_*>_>,_std::allocator<std::tuple<kratos::Var_*,_unsigned_int,_kratos::Var_*>_>_>
       ::end(&this->param_vars_size_);
  while( true ) {
    bVar1 = std::operator!=(&__end1_1,&local_168);
    if (!bVar1) break;
    __t = std::_Rb_tree_const_iterator<std::tuple<kratos::Var_*,_unsigned_int,_kratos::Var_*>_>::
          operator*(&__end1_1);
    ppVVar5 = std::get<0ul,kratos::Var*,unsigned_int,kratos::Var*>(__t);
    p_Var6 = std::get<1ul,kratos::Var*,unsigned_int,kratos::Var*>(__t);
    ppVVar7 = std::get<2ul,kratos::Var*,unsigned_int,kratos::Var*>(__t);
    Var::set_size_param(*ppVVar5,*p_Var6,*ppVVar7);
    std::_Rb_tree_const_iterator<std::tuple<kratos::Var_*,_unsigned_int,_kratos::Var_*>_>::
    operator++(&__end1_1);
  }
  __end1_2 = std::
             unordered_set<kratos::Param_*,_std::hash<kratos::Param_*>,_std::equal_to<kratos::Param_*>,_std::allocator<kratos::Param_*>_>
             ::begin(&this->param_params_);
  param = (Param **)
          std::
          unordered_set<kratos::Param_*,_std::hash<kratos::Param_*>,_std::equal_to<kratos::Param_*>,_std::allocator<kratos::Param_*>_>
          ::end(&this->param_params_);
  while( true ) {
    bVar1 = std::__detail::operator!=
                      (&__end1_2.super__Node_iterator_base<kratos::Param_*,_false>,
                       (_Node_iterator_base<kratos::Param_*,_false> *)&param);
    if (!bVar1) break;
    ppPVar8 = std::__detail::_Node_iterator<kratos::Param_*,_true,_false>::operator*(&__end1_2);
    (*((*ppPVar8)->super_Const).super_Var.super_IRNode._vptr_IRNode[0x2b])(*ppPVar8,local_a8);
    std::__detail::_Node_iterator<kratos::Param_*,_true,_false>::operator++(&__end1_2);
  }
  return;
}

Assistant:

void Param::set_value(int64_t new_value) {
    if (new_value <= 0 && !param_vars_width_.empty()) {
        throw VarException(
            ::format(
                "{0} is used for parametrizing variable width, thus cannot be non-positive ({1})",
                to_string(), new_value),
            {this});
    }
    Const::set_value(new_value);
    has_value_ = true;

    // change the width of parametrized variables
    for (const auto &var : param_vars_width_) {
        var->var_width() = new_value;
    }
    // change the size as well
    for (const auto &[var, index, expr] : param_vars_size_) {
        var->set_size_param(index, expr);
    }

    // change the entire chain
    for (const auto &param : param_params_) {
        param->set_value(new_value);
    }
}